

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

int ikcp_recv(ikcpcb *kcp,char *buffer,int len)

{
  IQUEUEHEAD *pIVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  IQUEUEHEAD *pIVar6;
  IQUEUEHEAD *pIVar7;
  int iVar8;
  IUINT32 IVar9;
  IQUEUEHEAD *pIVar10;
  int iVar11;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                  ,0x16b,"int ikcp_recv(ikcpcb *, char *, int)");
  }
  pIVar1 = &kcp->rcv_queue;
  if (pIVar1 == (kcp->rcv_queue).next) {
    iVar11 = -1;
  }
  else {
    iVar8 = ikcp_peeksize(kcp);
    if (iVar8 < 0) {
      iVar11 = -2;
    }
    else {
      iVar4 = -len;
      if (0 < len) {
        iVar4 = len;
      }
      iVar11 = -3;
      if (iVar8 <= iVar4) {
        uVar2 = kcp->rcv_wnd;
        uVar3 = kcp->nrcv_que;
        iVar11 = 0;
        pIVar10 = (kcp->rcv_queue).next;
        do {
          if (pIVar10 == pIVar1) break;
          pIVar6 = pIVar10->next;
          if (buffer == (char *)0x0) {
            buffer = (char *)0x0;
          }
          else {
            memcpy(buffer,pIVar10 + 4,(ulong)*(uint *)((long)&pIVar10[2].prev + 4));
            buffer = buffer + *(uint *)((long)&pIVar10[2].prev + 4);
          }
          iVar4 = *(int *)&pIVar10[1].prev;
          iVar11 = iVar11 + *(int *)((long)&pIVar10[2].prev + 4);
          if (((kcp->logmask & 8) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,8,"recv sn=%lu",(ulong)*(uint *)((long)&pIVar10[2].next + 4));
          }
          if (-1 < len) {
            pIVar7 = pIVar10->next;
            pIVar7->prev = pIVar10->prev;
            pIVar10->prev->next = pIVar7;
            pIVar10->next = (IQUEUEHEAD *)0x0;
            pIVar10->prev = (IQUEUEHEAD *)0x0;
            if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
              free(pIVar10);
            }
            else {
              (*ikcp_free_hook)(pIVar10);
            }
            kcp->nrcv_que = kcp->nrcv_que - 1;
          }
          pIVar10 = pIVar6;
        } while (iVar4 != 0);
        if (iVar11 != iVar8) {
          __assert_fail("len == peeksize",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                        ,0x199,"int ikcp_recv(ikcpcb *, char *, int)");
        }
        pIVar10 = (kcp->rcv_buf).next;
        if (&kcp->rcv_buf != pIVar10) {
          IVar9 = kcp->rcv_nxt;
          do {
            if ((IVar9 != *(IUINT32 *)((long)&pIVar10[2].next + 4)) ||
               (uVar5 = kcp->nrcv_que, kcp->rcv_wnd <= uVar5)) break;
            pIVar6 = pIVar10->next;
            pIVar6->prev = pIVar10->prev;
            pIVar10->prev->next = pIVar6;
            pIVar10->next = (IQUEUEHEAD *)0x0;
            pIVar10->prev = (IQUEUEHEAD *)0x0;
            kcp->nrcv_buf = kcp->nrcv_buf - 1;
            pIVar6 = (kcp->rcv_queue).prev;
            pIVar10->prev = pIVar6;
            pIVar10->next = pIVar1;
            pIVar6->next = pIVar10;
            (kcp->rcv_queue).prev = pIVar10;
            kcp->nrcv_que = uVar5 + 1;
            IVar9 = IVar9 + 1;
            kcp->rcv_nxt = IVar9;
            pIVar10 = (kcp->rcv_buf).next;
          } while (&kcp->rcv_buf != pIVar10);
        }
        if ((uVar2 <= uVar3) && (kcp->nrcv_que < kcp->rcv_wnd)) {
          *(byte *)&kcp->probe = (byte)kcp->probe | 2;
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int ikcp_recv(ikcpcb *kcp, char *buffer, int len)
{
	struct IQUEUEHEAD *p;
	int ispeek = (len < 0)? 1 : 0;
	int peeksize;
	int recover = 0;
	IKCPSEG *seg;
	assert(kcp);

	if (iqueue_is_empty(&kcp->rcv_queue))
		return -1;

	if (len < 0) len = -len;

	peeksize = ikcp_peeksize(kcp);

	if (peeksize < 0) 
		return -2;

	if (peeksize > len) 
		return -3;

	if (kcp->nrcv_que >= kcp->rcv_wnd)
		recover = 1;

	// merge fragment
	for (len = 0, p = kcp->rcv_queue.next; p != &kcp->rcv_queue; ) {
		int fragment;
		seg = iqueue_entry(p, IKCPSEG, node);
		p = p->next;

		if (buffer) {
			memcpy(buffer, seg->data, seg->len);
			buffer += seg->len;
		}

		len += seg->len;
		fragment = seg->frg;

		if (ikcp_canlog(kcp, IKCP_LOG_RECV)) {
			ikcp_log(kcp, IKCP_LOG_RECV, "recv sn=%lu", seg->sn);
		}

		if (ispeek == 0) {
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
			kcp->nrcv_que--;
		}

		if (fragment == 0) 
			break;
	}

	assert(len == peeksize);

	// move available data from rcv_buf -> rcv_queue
	while (! iqueue_is_empty(&kcp->rcv_buf)) {
		IKCPSEG *seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
		if (seg->sn == kcp->rcv_nxt && kcp->nrcv_que < kcp->rcv_wnd) {
			iqueue_del(&seg->node);
			kcp->nrcv_buf--;
			iqueue_add_tail(&seg->node, &kcp->rcv_queue);
			kcp->nrcv_que++;
			kcp->rcv_nxt++;
		}	else {
			break;
		}
	}

	// fast recover
	if (kcp->nrcv_que < kcp->rcv_wnd && recover) {
		// ready to send back IKCP_CMD_WINS in ikcp_flush
		// tell remote my window size
		kcp->probe |= IKCP_ASK_TELL;
	}

	return len;
}